

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O1

void __thiscall
opengv::absolute_pose::modules::Epnp::find_betas_approx_2
          (Epnp *this,Matrix<double,_6,_10,_0,_6,_10> *L_6x10,Matrix<double,_6,_1,_0,_6,_1> *Rho,
          double *betas)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  void *pvVar3;
  undefined8 *puVar4;
  double *pdVar5;
  long lVar6;
  SrcEvaluatorType srcEvaluator;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  VectorXd Rho_temp;
  VectorXd b3;
  MatrixXd L_6x3;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  assign_op<double,_double> local_289;
  Matrix<double,__1,_1,_0,__1,_1> local_288;
  DenseStorage<double,__1,__1,_1,_0> local_278;
  DenseStorage<double,__1,__1,__1,_0> local_268;
  SrcXprType local_250;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_240;
  
  local_268.m_data = (double *)0x0;
  local_268.m_rows = 0;
  local_268.m_cols = 0;
  lVar6 = 6;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_268,0x12,6,3);
  pdVar5 = local_268.m_data;
  do {
    *pdVar5 = *(double *)L_6x10;
    pdVar5[local_268.m_rows] = *(double *)((long)L_6x10 + 0x30);
    pdVar5[local_268.m_rows * 2] = *(double *)((long)L_6x10 + 0x60);
    L_6x10 = (Matrix<double,_6,_10,_0,_6,_10> *)((long)L_6x10 + 8);
    pdVar5 = pdVar5 + 1;
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_240,(MatrixType *)&local_268,0x14);
  local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  pvVar3 = malloc(0x70);
  if (pvVar3 == (void *)0x0) {
    pdVar5 = (double *)0x0;
  }
  else {
    *(void **)(((ulong)pvVar3 & 0xffffffffffffffc0) + 0x38) = pvVar3;
    pdVar5 = (double *)(((ulong)pvVar3 & 0xffffffffffffffc0) + 0x40);
  }
  if (pdVar5 == (double *)0x0) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = operator_delete;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 6;
  lVar6 = 0;
  do {
    pdVar5[lVar6] =
         (Rho->super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).m_storage.m_data.array
         [lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  local_250.m_rhs = &local_288;
  local_278 = (DenseStorage<double,__1,__1,_1,_0>)(ZEXT816(0) << 0x20);
  local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar5
  ;
  local_250.m_dec =
       &local_240.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_278,
             local_240.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
             .m_cols,1);
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Solve<Eigen::SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>_>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,__1,_1,_0,__1,_1> *)&local_278,&local_250,&local_289);
  dVar9 = *local_278.m_data;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar9;
  if (0.0 <= dVar9) {
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      auVar8 = vsqrtsd_avx(auVar8,auVar8);
      dVar9 = auVar8._0_8_;
    }
    *betas = dVar9;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_278.m_data[2];
    dVar9 = 0.0;
    if (local_278.m_data[2] <= 0.0) goto LAB_0017e0e3;
  }
  else {
    auVar12._0_8_ = -dVar9;
    auVar12._8_8_ = 0x8000000000000000;
    if (-0.0 < dVar9) {
      dVar9 = sqrt(auVar12._0_8_);
    }
    else {
      auVar8 = vsqrtsd_avx(auVar12,auVar12);
      dVar9 = auVar8._0_8_;
    }
    *betas = dVar9;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_278.m_data[2];
    dVar9 = 0.0;
    if (0.0 <= local_278.m_data[2]) goto LAB_0017e0e3;
    auVar1._8_8_ = 0x8000000000000000;
    auVar1._0_8_ = 0x8000000000000000;
    auVar7 = vxorpd_avx512vl(auVar10,auVar1);
  }
  if (auVar7._0_8_ < 0.0) {
    dVar9 = sqrt(auVar7._0_8_);
  }
  else {
    auVar8 = vsqrtsd_avx(auVar7,auVar7);
    dVar9 = auVar8._0_8_;
  }
LAB_0017e0e3:
  betas[1] = dVar9;
  if (local_278.m_data[1] < 0.0) {
    auVar11._8_8_ = 0;
    auVar11._0_8_ = *betas;
    auVar2._8_8_ = 0x8000000000000000;
    auVar2._0_8_ = 0x8000000000000000;
    auVar8 = vxorpd_avx512vl(auVar11,auVar2);
    dVar9 = (double)vmovlpd_avx(auVar8);
    *betas = dVar9;
  }
  betas[2] = 0.0;
  betas[3] = 0.0;
  if (local_278.m_data != (double *)0x0) {
    free((void *)local_278.m_data[-1]);
  }
  if (local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_288.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data[-1]);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_240);
  if (local_268.m_data != (double *)0x0) {
    free((void *)local_268.m_data[-1]);
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::find_betas_approx_2(
    const Eigen::Matrix<double,6,10> & L_6x10,
    const Eigen::Matrix<double,6,1> & Rho,
    double * betas)
{
  Eigen::MatrixXd L_6x3(6,3);

  for(int i = 0; i < 6; i++)
  {
    L_6x3(i,0) = L_6x10(i,0);
    L_6x3(i,1) = L_6x10(i,1);
    L_6x3(i,2) = L_6x10(i,2);
  }

  Eigen::JacobiSVD<Eigen::MatrixXd> SVD(
      L_6x3,
      Eigen::ComputeFullV | Eigen::ComputeFullU);
  Eigen::VectorXd Rho_temp = Rho;
  Eigen::VectorXd b3 = SVD.solve(Rho_temp);

  if (b3[0] < 0)
  {
    betas[0] = sqrt(-b3[0]);
    betas[1] = (b3[2] < 0) ? sqrt(-b3[2]) : 0.0;
  }
  else
  {
    betas[0] = sqrt(b3[0]);
    betas[1] = (b3[2] > 0) ? sqrt(b3[2]) : 0.0;
  }

  if (b3[1] < 0) betas[0] = -betas[0];

  betas[2] = 0.0;
  betas[3] = 0.0;
}